

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_option_name_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt,bool is_positional)

{
  bool is_positional_local;
  Option *opt_local;
  Formatter *this_local;
  
  if (is_positional) {
    Option::get_name_abi_cxx11_(__return_storage_ptr__,opt,true,false);
  }
  else {
    Option::get_name_abi_cxx11_(__return_storage_ptr__,opt,false,true);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_option_name(const Option *opt, bool is_positional) const {
    if(is_positional)
        return opt->get_name(true, false);

    return opt->get_name(false, true);
}